

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS
ref_part_bin_ugrid_pack_cell
          (FILE *file,REF_BOOL swap_endian,REF_BOOL sixty_four_bit,REF_FILEPOS conn_offset,
          REF_FILEPOS faceid_offset,REF_INT section_size,REF_LONG ncell_read,REF_INT node_per,
          REF_INT size_per,REF_GLOB *c2n)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  size_t sVar4;
  undefined1 *puVar5;
  void *pvVar6;
  char *yp_3;
  char *xp_3;
  int y_3;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_INT *tag_1;
  char *yp_2;
  char *xp_2;
  int y_2;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_INT *c2t_1;
  char *yp_1;
  char *xp_1;
  long y_1;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG *tag;
  char *yp;
  char *xp;
  long y;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_LONG *c2t;
  REF_FILEPOS ibyte;
  int local_38;
  REF_INT node;
  REF_INT cell;
  REF_INT section_size_local;
  REF_FILEPOS faceid_offset_local;
  REF_FILEPOS conn_offset_local;
  REF_BOOL sixty_four_bit_local;
  REF_BOOL swap_endian_local;
  FILE *file_local;
  
  iVar1 = 4;
  if (sixty_four_bit != 0) {
    iVar1 = 8;
  }
  lVar2 = (long)iVar1;
  if (sixty_four_bit == 0) {
    if (node_per * section_size < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x454,
             "ref_part_bin_ugrid_pack_cell","malloc c2t of REF_INT negative");
      return 1;
    }
    pvVar3 = malloc((long)(node_per * section_size) << 2);
    if (pvVar3 == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x454,
             "ref_part_bin_ugrid_pack_cell","malloc c2t of REF_INT NULL");
      return 2;
    }
    iVar1 = fseeko((FILE *)file,conn_offset + lVar2 * node_per * ncell_read,0);
    if ((long)iVar1 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x458,
             "ref_part_bin_ugrid_pack_cell","seek conn failed",0,(long)iVar1);
      return 1;
    }
    sVar4 = fread(pvVar3,4,(long)(section_size * node_per),(FILE *)file);
    if ((long)(section_size * node_per) != sVar4) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x45b,
             "ref_part_bin_ugrid_pack_cell","cn",(long)(section_size * node_per),sVar4);
      return 1;
    }
    for (local_38 = 0; local_38 < section_size * node_per; local_38 = local_38 + 1) {
      if (swap_endian != 0) {
        puVar5 = (undefined1 *)((long)pvVar3 + (long)local_38 * 4);
        xp_2._7_1_ = *puVar5;
        xp_2._6_1_ = puVar5[1];
        xp_2._5_1_ = puVar5[2];
        xp_2._4_1_ = puVar5[3];
        *(undefined4 *)((long)pvVar3 + (long)local_38 * 4) = xp_2._4_4_;
      }
    }
    for (local_38 = 0; local_38 < section_size; local_38 = local_38 + 1) {
      for (ibyte._4_4_ = 0; ibyte._4_4_ < node_per; ibyte._4_4_ = ibyte._4_4_ + 1) {
        c2n[ibyte._4_4_ + size_per * local_38] =
             (long)(*(int *)((long)pvVar3 + (long)(ibyte._4_4_ + node_per * local_38) * 4) + -1);
      }
    }
    if (node_per != size_per) {
      if (section_size < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x466,"ref_part_bin_ugrid_pack_cell","malloc tag of REF_INT negative");
        return 1;
      }
      pvVar6 = malloc((long)section_size << 2);
      if (pvVar6 == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x466,"ref_part_bin_ugrid_pack_cell","malloc tag of REF_INT NULL");
        return 2;
      }
      iVar1 = fseeko((FILE *)file,faceid_offset + lVar2 * ncell_read,0);
      if ((long)iVar1 != 0) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x46a,"ref_part_bin_ugrid_pack_cell","seek tag failed",0,(long)iVar1);
        return 1;
      }
      sVar4 = fread(pvVar6,4,(long)section_size,(FILE *)file);
      if ((long)section_size != sVar4) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x46c,"ref_part_bin_ugrid_pack_cell","tag");
        return 1;
      }
      for (local_38 = 0; local_38 < section_size; local_38 = local_38 + 1) {
        if (swap_endian != 0) {
          puVar5 = (undefined1 *)((long)pvVar6 + (long)local_38 * 4);
          xp_3._7_1_ = *puVar5;
          xp_3._6_1_ = puVar5[1];
          xp_3._5_1_ = puVar5[2];
          xp_3._4_1_ = puVar5[3];
          *(undefined4 *)((long)pvVar6 + (long)local_38 * 4) = xp_3._4_4_;
        }
      }
      for (local_38 = 0; local_38 < section_size; local_38 = local_38 + 1) {
        c2n[node_per + local_38 * size_per] = (long)*(int *)((long)pvVar6 + (long)local_38 * 4);
      }
      if (pvVar6 != (void *)0x0) {
        free(pvVar6);
      }
    }
    if (pvVar3 != (void *)0x0) {
      free(pvVar3);
    }
  }
  else {
    if (node_per * section_size < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x430,
             "ref_part_bin_ugrid_pack_cell","malloc c2t of REF_LONG negative");
      return 1;
    }
    pvVar3 = malloc((long)(node_per * section_size) << 3);
    if (pvVar3 == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x430,
             "ref_part_bin_ugrid_pack_cell","malloc c2t of REF_LONG NULL");
      return 2;
    }
    iVar1 = fseeko((FILE *)file,conn_offset + lVar2 * node_per * ncell_read,0);
    if ((long)iVar1 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x434,
             "ref_part_bin_ugrid_pack_cell","seek conn failed",0,(long)iVar1);
      return 1;
    }
    sVar4 = fread(pvVar3,8,(long)(section_size * node_per),(FILE *)file);
    if ((long)(section_size * node_per) != sVar4) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x437,
             "ref_part_bin_ugrid_pack_cell","cn");
      return 1;
    }
    for (local_38 = 0; local_38 < section_size * node_per; local_38 = local_38 + 1) {
      if (swap_endian != 0) {
        puVar5 = (undefined1 *)((long)pvVar3 + (long)local_38 * 8);
        xp._7_1_ = *puVar5;
        xp._6_1_ = puVar5[1];
        xp._5_1_ = puVar5[2];
        xp._4_1_ = puVar5[3];
        xp._3_1_ = puVar5[4];
        xp._2_1_ = puVar5[5];
        xp._1_1_ = puVar5[6];
        xp._0_1_ = puVar5[7];
        *(char **)((long)pvVar3 + (long)local_38 * 8) = xp;
      }
    }
    for (local_38 = 0; local_38 < section_size; local_38 = local_38 + 1) {
      for (ibyte._4_4_ = 0; ibyte._4_4_ < node_per; ibyte._4_4_ = ibyte._4_4_ + 1) {
        c2n[ibyte._4_4_ + size_per * local_38] =
             *(long *)((long)pvVar3 + (long)(ibyte._4_4_ + node_per * local_38) * 8) + -1;
      }
    }
    if (node_per != size_per) {
      if (section_size < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x442,"ref_part_bin_ugrid_pack_cell","malloc tag of REF_LONG negative");
        return 1;
      }
      pvVar6 = malloc((long)section_size << 3);
      if (pvVar6 == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x442,"ref_part_bin_ugrid_pack_cell","malloc tag of REF_LONG NULL");
        return 2;
      }
      iVar1 = fseeko((FILE *)file,faceid_offset + lVar2 * ncell_read,0);
      if ((long)iVar1 != 0) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x446,"ref_part_bin_ugrid_pack_cell","seek tag failed",0,(long)iVar1);
        return 1;
      }
      sVar4 = fread(pvVar6,8,(long)section_size,(FILE *)file);
      if ((long)section_size != sVar4) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x448,"ref_part_bin_ugrid_pack_cell","tag");
        return 1;
      }
      for (local_38 = 0; local_38 < section_size; local_38 = local_38 + 1) {
        if (swap_endian != 0) {
          puVar5 = (undefined1 *)((long)pvVar6 + (long)local_38 * 8);
          xp_1._7_1_ = *puVar5;
          xp_1._6_1_ = puVar5[1];
          xp_1._5_1_ = puVar5[2];
          xp_1._4_1_ = puVar5[3];
          xp_1._3_1_ = puVar5[4];
          xp_1._2_1_ = puVar5[5];
          xp_1._1_1_ = puVar5[6];
          xp_1._0_1_ = puVar5[7];
          *(char **)((long)pvVar6 + (long)local_38 * 8) = xp_1;
        }
      }
      for (local_38 = 0; local_38 < section_size; local_38 = local_38 + 1) {
        c2n[node_per + local_38 * size_per] = *(REF_GLOB *)((long)pvVar6 + (long)local_38 * 8);
      }
      if (pvVar6 != (void *)0x0) {
        free(pvVar6);
      }
    }
    if (pvVar3 != (void *)0x0) {
      free(pvVar3);
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_part_bin_ugrid_pack_cell(
    FILE *file, REF_BOOL swap_endian, REF_BOOL sixty_four_bit,
    REF_FILEPOS conn_offset, REF_FILEPOS faceid_offset, REF_INT section_size,
    REF_LONG ncell_read, REF_INT node_per, REF_INT size_per, REF_GLOB *c2n) {
  REF_INT cell, node;
  REF_FILEPOS ibyte;
  ibyte = (sixty_four_bit ? 8 : 4);

  if (sixty_four_bit) {
    REF_LONG *c2t;
    ref_malloc(c2t, node_per * section_size, REF_LONG);
    REIS(0,
         fseeko(file, conn_offset + ibyte * node_per * (REF_FILEPOS)ncell_read,
                SEEK_SET),
         "seek conn failed");
    RES((size_t)(section_size * node_per),
        fread(c2t, sizeof(REF_LONG), (size_t)(section_size * node_per), file),
        "cn");
    for (cell = 0; cell < section_size * node_per; cell++) {
      if (swap_endian) SWAP_LONG(c2t[cell]);
    }
    for (cell = 0; cell < section_size; cell++) {
      for (node = 0; node < node_per; node++) {
        c2n[node + size_per * cell] = c2t[node + node_per * cell] - 1;
      }
    }
    if (node_per != size_per) {
      REF_LONG *tag;
      ref_malloc(tag, section_size, REF_LONG);
      REIS(0,
           fseeko(file, faceid_offset + ibyte * (REF_FILEPOS)ncell_read,
                  SEEK_SET),
           "seek tag failed");
      RES((size_t)(section_size),
          fread(tag, sizeof(REF_LONG), (size_t)section_size, file), "tag");
      for (cell = 0; cell < section_size; cell++) {
        if (swap_endian) SWAP_LONG(tag[cell]);
      }
      /* sort into right locations */
      for (cell = 0; cell < section_size; cell++)
        c2n[node_per + cell * size_per] = tag[cell];
      ref_free(tag);
    }
    ref_free(c2t);
  } else {
    REF_INT *c2t;
    ref_malloc(c2t, node_per * section_size, REF_INT);
    REIS(0,
         fseeko(file, conn_offset + ibyte * node_per * (REF_FILEPOS)ncell_read,
                SEEK_SET),
         "seek conn failed");
    REIS((size_t)(section_size * node_per),
         fread(c2t, sizeof(REF_INT), (size_t)(section_size * node_per), file),
         "cn");
    for (cell = 0; cell < section_size * node_per; cell++) {
      if (swap_endian) SWAP_INT(c2t[cell]);
    }
    for (cell = 0; cell < section_size; cell++) {
      for (node = 0; node < node_per; node++) {
        c2n[node + size_per * cell] = c2t[node + node_per * cell] - 1;
      }
    }
    if (node_per != size_per) {
      REF_INT *tag;
      ref_malloc(tag, section_size, REF_INT);
      REIS(0,
           fseeko(file, faceid_offset + ibyte * (REF_FILEPOS)ncell_read,
                  SEEK_SET),
           "seek tag failed");
      RES((size_t)(section_size),
          fread(tag, sizeof(REF_INT), (size_t)section_size, file), "tag");
      for (cell = 0; cell < section_size; cell++) {
        if (swap_endian) SWAP_INT(tag[cell]);
      }
      /* sort into right locations */
      for (cell = 0; cell < section_size; cell++)
        c2n[node_per + cell * size_per] = tag[cell];
      ref_free(tag);
    }
    ref_free(c2t);
  }
  return REF_SUCCESS;
}